

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

RegVmReturnType __thiscall
ExecutorRegVm::ExecReturn
          (ExecutorRegVm *this,RegVmCmd cmd,RegVmCmd *instruction,RegVmRegister *regFilePtr)

{
  uint uVar1;
  uint uVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar3;
  RegVmReturnType RVar4;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *__dest;
  uint *puVar5;
  uint *puVar6;
  RegVmCmd *local_38;
  
  RVar4 = cmd._2_4_ & 0xff;
  if (cmd.rB == '\0') {
LAB_00223e24:
    uVar1 = (this->callStack).count;
    if (uVar1 != this->lastFinalReturn) {
      FastVector<RegVmCmd_*,_false,_false>::pop_back(&this->callStack);
      return RVar4;
    }
    if (uVar1 != 0) {
      return RVar4;
    }
  }
  else {
    if (RVar4 != rvrError) {
      __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
      puVar6 = (this->exLinker->exRegVmConstants).data + ((ulong)cmd >> 0x20);
      puVar5 = puVar6 + 2;
      uVar1 = *puVar6;
LAB_00223d6b:
      puVar5 = puVar5 + 3;
switchD_00223d8f_default:
      puVar6 = puVar5;
      if (puVar6[-3] == 7) {
        if (cmd.rC != '\0') {
          ExecCheckedReturn(this,uVar1,regFilePtr);
        }
        goto LAB_00223e24;
      }
      puVar5 = puVar6 + 1;
      switch(puVar6[-3]) {
      case 2:
        goto switchD_00223d8f_caseD_2;
      case 3:
        aVar3 = regFilePtr[puVar6[-2]].field_0;
        break;
      case 4:
        uVar2 = puVar6[-2];
        goto LAB_00223ddf;
      case 5:
        aVar3.longValue._4_4_ = 0;
        aVar3.intValue = puVar6[-2];
        break;
      case 6:
        uVar2 = *puVar6;
        memcpy(__dest,(void *)((ulong)puVar6[-1] + regFilePtr[puVar6[-2]].field_0.longValue),
               (ulong)uVar2);
        __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                 ((long)__dest + (ulong)(uVar2 & 0xfffffffc));
        goto LAB_00223d6b;
      default:
        goto switchD_00223d8f_default;
      }
      puVar5 = puVar6 + -1;
      *__dest = aVar3;
      __dest = __dest + 1;
      goto LAB_00223d6b;
    }
    uVar1 = (this->callStack).count;
    local_38 = instruction + 1;
    FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,&local_38);
    if (uVar1 == 0) {
      RVar4 = rvrVoid;
    }
    else {
      Stop(this,"ERROR: function didn\'t return a value");
      RVar4 = rvrError;
    }
  }
  this->codeRunning = false;
  return RVar4;
switchD_00223d8f_caseD_2:
  uVar2 = regFilePtr[puVar6[-2]].field_0.intValue;
LAB_00223ddf:
  puVar5 = puVar6 + -1;
  __dest->intValue = uVar2;
  __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)__dest + 4);
  goto LAB_00223d6b;
}

Assistant:

RegVmReturnType ExecutorRegVm::ExecReturn(const RegVmCmd cmd, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	if(cmd.rB == rvrError)
	{
		bool errorState = !callStack.empty();

		callStack.push_back(instruction + 1);

		if(errorState)
			Stop("ERROR: function didn't return a value");

		codeRunning = false;

		return errorState ? rvrError : rvrVoid;
	}

	if(cmd.rB != rvrVoid)
	{
		unsigned *microcode = exLinker->exRegVmConstants.data + cmd.argument;

		unsigned typeId = *microcode++;

		// Skip type size
		microcode++;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPush:
				*tempStackPtr = regFilePtr[*microcode++].intValue;
				tempStackPtr += 1;
				break;
			case rvmiPushQword:
				memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
				tempStackPtr += 2;
				break;
			case rvmiPushImm:
				*tempStackPtr = *microcode++;
				tempStackPtr += 1;
				break;
			case rvmiPushImmq:
				vmStoreLong(tempStackPtr, *microcode++);
				tempStackPtr += 2;
				break;
			case rvmiPushMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
				tempStackPtr += size >> 2;
			}
			break;
			}
		}

		if(cmd.rC)
			ExecCheckedReturn(typeId, regFilePtr);
	}

	if(callStack.size() == lastFinalReturn)
	{
		if(lastFinalReturn == 0)
			codeRunning = false;

		return RegVmReturnType(cmd.rB);
	}

	callStack.pop_back();

	return RegVmReturnType(cmd.rB);
}